

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__pnm_skip_whitespace(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  stbi_uc *psVar3;
  
LAB_0011448b:
  do {
    if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
      iVar2 = (*(s->io).eof)(s->io_user_data);
      if (iVar2 == 0) goto LAB_001144b5;
      if (s->read_from_callbacks != 0) goto LAB_001144a5;
LAB_00114500:
      if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
        iVar2 = (*(s->io).eof)(s->io_user_data);
        if (iVar2 == 0) goto LAB_00114532;
        if (s->read_from_callbacks == 0) {
          return;
        }
      }
      if (s->img_buffer_end <= s->img_buffer) {
        return;
      }
LAB_00114532:
      if (*c != '#') {
        return;
      }
      do {
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00114559:
          if (s->img_buffer_end <= s->img_buffer) goto LAB_0011448b;
        }
        else {
          iVar2 = (*(s->io).eof)(s->io_user_data);
          if (iVar2 != 0) {
            if (s->read_from_callbacks != 0) goto LAB_00114559;
            goto LAB_0011448b;
          }
        }
        if ((*c == '\n') || (*c == '\r')) goto LAB_0011448b;
        psVar3 = s->img_buffer;
        if (psVar3 < s->img_buffer_end) {
LAB_001145a8:
          s->img_buffer = psVar3 + 1;
          sVar1 = *psVar3;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            psVar3 = s->img_buffer;
            goto LAB_001145a8;
          }
          sVar1 = '\0';
        }
        *c = sVar1;
      } while( true );
    }
LAB_001144a5:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_00114500;
LAB_001144b5:
    if ((4 < (byte)*c - 9) && (*c != 0x20)) goto LAB_00114500;
    psVar3 = s->img_buffer;
    if (psVar3 < s->img_buffer_end) {
LAB_001144ea:
      s->img_buffer = psVar3 + 1;
      sVar1 = *psVar3;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        psVar3 = s->img_buffer;
        goto LAB_001144ea;
      }
      sVar1 = '\0';
    }
    *c = sVar1;
  } while( true );
}

Assistant:

static void     stbi__pnm_skip_whitespace(stbi__context *s, char *c)
{
   for (;;) {
      while (!stbi__at_eof(s) && stbi__pnm_isspace(*c))
         *c = (char) stbi__get8(s);

      if (stbi__at_eof(s) || *c != '#')
         break;

      while (!stbi__at_eof(s) && *c != '\n' && *c != '\r' )
         *c = (char) stbi__get8(s);
   }
}